

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocaleData::exponentForm
          (QString *__return_storage_ptr__,QLocaleData *this,QString *digits,int decpt,int precision
          ,PrecisionMode pm,bool mustMarkDecimal,int minExponentDigits)

{
  qsizetype qVar1;
  Data *pDVar2;
  ulong uVar3;
  char16_t *pcVar4;
  long in_FS_OFFSET;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  localeString(&local_58,this,ZeroDigit,
               (DataRange)((ulong)this->m_zero_size << 0x20 | (ulong)this->m_zero_idx));
  qVar1 = local_58.d.size;
  if (pm == PMSignificantDigits) {
    uVar3 = (ulong)(digits->d).size / (ulong)local_58.d.size;
    if ((long)uVar3 < (long)precision) {
      do {
        QString::append(digits,&local_58);
        uVar3 = uVar3 + 1;
      } while ((long)uVar3 < (long)precision);
    }
  }
  else if (pm == PMDecimalDigits) {
    uVar3 = (ulong)(digits->d).size / (ulong)local_58.d.size;
    if ((long)uVar3 < (long)(precision + 1)) {
      do {
        QString::append(digits,&local_58);
        uVar3 = uVar3 + 1;
      } while ((long)uVar3 < (long)(precision + 1));
    }
  }
  if ((mustMarkDecimal) || ((ulong)qVar1 < (undefined1 *)(digits->d).size)) {
    localeString(&local_78,this,DecimalPoint,
                 (DataRange)
                 ((ulong)this->m_decimalSeparator_size << 0x20 | (ulong)this->m_decimalSeparator_idx
                 ));
    pcVar4 = local_78.d.ptr;
    if ((QChar *)local_78.d.ptr == (QChar *)0x0) {
      pcVar4 = L"";
    }
    QString::insert(digits,qVar1,(QChar *)pcVar4,local_78.d.size);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((ulong)this->m_exponential_size == 0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (char16_t *)0x0;
    local_78.d.size = 0;
  }
  else {
    QString::fromRawData
              ((QChar *)(
                        L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
                        + this->m_exponential_idx),(ulong)this->m_exponential_size);
  }
  QString::append(digits,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  longLongToString(&local_78,this,(long)(decpt + -1),minExponentDigits,10,-1,0x10);
  QString::append(digits,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (digits->d).d;
  pcVar4 = (digits->d).ptr;
  (digits->d).d = (Data *)0x0;
  (digits->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = pcVar4;
  qVar1 = (digits->d).size;
  (digits->d).size = 0;
  (__return_storage_ptr__->d).size = qVar1;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocaleData::exponentForm(QString &&digits, int decpt, int precision,
                                  PrecisionMode pm, bool mustMarkDecimal,
                                  int minExponentDigits) const
{
    const QString zero = zeroDigit();
    const auto digitWidth = zero.size();
    Q_ASSERT(digitWidth == 1 || digitWidth == 2);
    Q_ASSERT(digits.size() % digitWidth == 0);

    switch (pm) {
    case PMDecimalDigits:
        for (qsizetype i = digits.size() / digitWidth; i < precision + 1; ++i)
            digits.append(zero);
        break;
    case PMSignificantDigits:
        for (qsizetype i = digits.size() / digitWidth; i < precision; ++i)
            digits.append(zero);
        break;
    case PMChopTrailingZeros:
        Q_ASSERT(digits.size() / digitWidth <= 1 || !digits.endsWith(zero));
        break;
    }

    if (mustMarkDecimal || digits.size() > digitWidth)
        digits.insert(digitWidth, decimalPoint());

    digits.append(exponentSeparator());
    digits.append(longLongToString(decpt - 1, minExponentDigits, 10, -1, AlwaysShowSign));

    return std::move(digits);
}